

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void deinterleave_data(float *in,float *out,int frames,int channels)

{
  int local_28;
  int local_24;
  int ch;
  int fr;
  int channels_local;
  int frames_local;
  float *out_local;
  float *in_local;
  
  for (local_28 = 0; local_28 < channels; local_28 = local_28 + 1) {
    for (local_24 = 0; local_24 < frames; local_24 = local_24 + 1) {
      out[local_24 + frames * local_28] = in[local_28 + channels * local_24];
    }
  }
  return;
}

Assistant:

void
deinterleave_data (const float *in, float *out, int frames, int channels)
{	int fr, ch ;

	for (ch = 0 ; ch < channels ; ch++)
		for (fr = 0 ; fr < frames ; fr++)
			out [fr + frames * ch] = in [ch + channels * fr] ;

	return ;
}